

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O0

void __thiscall cmInstalledFile::~cmInstalledFile(cmInstalledFile *this)

{
  cmCompiledGeneratorExpression *this_00;
  cmInstalledFile *this_local;
  
  if ((this->NameExpression != (cmCompiledGeneratorExpression *)0x0) &&
     (this_00 = this->NameExpression, this_00 != (cmCompiledGeneratorExpression *)0x0)) {
    cmCompiledGeneratorExpression::~cmCompiledGeneratorExpression(this_00);
    operator_delete(this_00,0x1a0);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
  ::~map(&this->Properties);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmInstalledFile::~cmInstalledFile()
{
  if(NameExpression)
    {
    delete NameExpression;
    }
}